

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

WhereTerm * findTerm(WhereClause *pWC,int iCur,int iColumn,Bitmask notReady,u32 op,Index *pIdx)

{
  WhereTerm *pWVar1;
  WhereTerm *pWVar2;
  WhereScan scan;
  WhereScan WStack_98;
  
  pWVar1 = whereScanInit(&WStack_98,pWC,iCur,iColumn,op,pIdx);
  pWVar2 = (WhereTerm *)0x0;
  do {
    if (pWVar1 == (WhereTerm *)0x0) {
      return pWVar2;
    }
    if ((pWVar1->prereqRight & notReady) == 0) {
      if ((pWVar1->prereqRight == 0) && ((pWVar1->eOperator & 2) != 0)) {
        return pWVar1;
      }
      if (pWVar2 == (WhereTerm *)0x0) {
        pWVar2 = pWVar1;
      }
    }
    pWVar1 = whereScanNext(&WStack_98);
  } while( true );
}

Assistant:

static WhereTerm *findTerm(
  WhereClause *pWC,     /* The WHERE clause to be searched */
  int iCur,             /* Cursor number of LHS */
  int iColumn,          /* Column number of LHS */
  Bitmask notReady,     /* RHS must not overlap with this mask */
  u32 op,               /* Mask of WO_xx values describing operator */
  Index *pIdx           /* Must be compatible with this index, if not NULL */
){
  WhereTerm *pResult = 0;
  WhereTerm *p;
  WhereScan scan;

  p = whereScanInit(&scan, pWC, iCur, iColumn, op, pIdx);
  while( p ){
    if( (p->prereqRight & notReady)==0 ){
      if( p->prereqRight==0 && (p->eOperator&WO_EQ)!=0 ){
        return p;
      }
      if( pResult==0 ) pResult = p;
    }
    p = whereScanNext(&scan);
  }
  return pResult;
}